

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O0

void ddb(Integer ndims,Integer *ardims,Integer npes,Integer *blk,Integer *pedims)

{
  long lVar1;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  long in_RCX;
  long in_RDX;
  Integer *in_RSI;
  Integer *in_RDI;
  long in_R8;
  Integer unaff_retaddr;
  double in_stack_00000008;
  long sp;
  long tp;
  Integer *tpedim;
  Integer *tblk;
  Integer *tardim;
  Integer count;
  long j;
  long i;
  long ddb_bias;
  double ddb_threshold;
  long local_70;
  size_t local_50;
  long local_48;
  long local_40;
  
  local_50 = 0;
  local_70 = in_RDX;
  for (local_40 = (long)in_RDI + -1; lVar1 = local_70, -1 < local_40; local_40 = local_40 + -1) {
    if (*(long *)(in_RCX + local_40 * 8) < 1) {
      *(undefined8 *)(in_R8 + local_40 * 8) = 0xffffffffffffffff;
      local_50 = local_50 + 1;
    }
    else {
      local_48 = (in_RSI[local_40] + *(long *)(in_RCX + local_40 * 8) + -1) /
                 *(long *)(in_RCX + local_40 * 8);
      if (local_70 < local_48) {
        local_70 = 1;
        *(long *)(in_R8 + local_40 * 8) = lVar1;
      }
      else {
        for (; local_48 < local_70 && local_70 % local_48 != 0; local_48 = local_48 + 1) {
        }
        *(long *)(in_R8 + local_40 * 8) = local_48;
        local_70 = local_70 / local_48;
      }
    }
  }
  if ((long)local_50 < 1) {
    for (local_48 = 0; local_48 < (long)in_RDI; local_48 = local_48 + 1) {
      if (*(long *)(in_R8 + local_48 * 8) < 0) {
        *(undefined8 *)(in_R8 + local_48 * 8) = 1;
      }
    }
  }
  else {
    __ptr = calloc(local_50,8);
    if (__ptr == (void *)0x0) {
      fprintf(_stderr,"ddb: Memory allocation failed\n");
      for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
        *(undefined8 *)(in_R8 + local_40 * 8) = 0;
      }
    }
    else {
      __ptr_00 = calloc(local_50,8);
      if (__ptr_00 == (void *)0x0) {
        fprintf(_stderr,"ddb: Memory allocation failed\n");
        for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
          *(undefined8 *)(in_R8 + local_40 * 8) = 0;
        }
      }
      else {
        __ptr_01 = calloc(local_50,8);
        if (__ptr_01 == (void *)0x0) {
          fprintf(_stderr,"ddb: Memory allocation failed\n");
          for (local_40 = 0; local_40 < (long)in_RDI; local_40 = local_40 + 1) {
            *(undefined8 *)(in_R8 + local_40 * 8) = 0;
          }
        }
        else {
          for (local_40 = 0; local_40 < (long)local_50; local_40 = local_40 + 1) {
            *(undefined8 *)((long)__ptr_00 + local_40 * 8) = 1;
          }
          local_40 = 0;
          for (local_48 = 0; local_48 < (long)in_RDI; local_48 = local_48 + 1) {
            if (*(long *)(in_R8 + local_48 * 8) < 0) {
              *(Integer *)((long)__ptr + local_40 * 8) = in_RSI[local_48];
              local_40 = local_40 + 1;
            }
          }
          ddb_h2((Integer)tpedim,(Integer *)tp,sp,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI);
          local_40 = 0;
          for (local_48 = 0; local_48 < (long)in_RDI; local_48 = local_48 + 1) {
            if (*(long *)(in_R8 + local_48 * 8) < 0) {
              *(long *)(in_RCX + local_48 * 8) =
                   (*(long *)((long)__ptr + local_40 * 8) + *(long *)((long)__ptr_01 + local_40 * 8)
                   + -1) / *(long *)((long)__ptr_01 + local_40 * 8);
              local_40 = local_40 + 1;
            }
          }
          local_40 = 0;
          for (local_48 = 0; local_48 < (long)in_RDI; local_48 = local_48 + 1) {
            if (*(long *)(in_R8 + local_48 * 8) < 0) {
              *(undefined8 *)(in_R8 + local_48 * 8) = *(undefined8 *)((long)__ptr_01 + local_40 * 8)
              ;
              local_40 = local_40 + 1;
            }
          }
          free(__ptr_01);
          free(__ptr_00);
          free(__ptr);
        }
      }
    }
  }
  return;
}

Assistant:

void ddb(Integer ndims, Integer ardims[], Integer npes, Integer blk[],
         Integer pedims[])
{
    double ddb_threshold = 0.1;
    long ddb_bias = 0;
    long i, j;
    Integer count = 0;
    Integer *tardim, *tblk, *tpedim;
    long tp, sp;

    tp = (long)npes;

    /* count how many axes have <don't care> block values.*/
    for(i=ndims-1;i>=0;i--){
       if(blk[i]<=0){
          pedims[i] = -1;
          count += 1;
       } else {
          sp = (long)(ardims[i]+blk[i]-1)/blk[i];
          if(sp>tp) {
             sp = tp; tp = 1;
             pedims[i] = (Integer)sp;
          } else {
             for(j=sp;j<tp&&(tp%j!=0);j++);
             pedims[i] = (Integer)j;
             tp = tp / j;
          }
       }
    }

    if(count>0){
       tardim = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tardim==NULL) {
         fprintf(stderr,"ddb: Memory allocation failed\n");
         for(i=0;i<ndims;i++) pedims[i] = 0;
         return;
       }
       tblk = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tblk==NULL) {
          fprintf(stderr,"ddb: Memory allocation failed\n");
          for(i=0;i<ndims;i++) pedims[i] = 0;
          return;
       }
       tpedim = (Integer *) calloc((size_t)count,sizeof(Integer));
       if(tpedim==NULL) {
          fprintf(stderr,"ddb: Memory allocation failed\n");
          for(i=0;i<ndims;i++) pedims[i] = 0;
          return;
       }

       for(i=0;i<count;i++) tblk[i] = 1;
       for(i=0,j=0;j<ndims;j++) 
          if(pedims[j]<0) tardim[i++] = ardims[j];

       ddb_h2( count, tardim, (Integer)tp, ddb_threshold, ddb_bias, tblk, tpedim);
       /* ddb_h1( count, tardim, tp, ddb_threshold, tblk, tpedim); */

       for(i=0,j=0;j<ndims;j++)
          if(pedims[j]<0){
             blk[j] = (tardim[i]+tpedim[i]-1)/tpedim[i];
             i = i+1;
          }

       for(i=0,j=0;j<ndims;j++)
          if(pedims[j]<0) pedims[j] = tpedim[i++];

       free( tpedim ); 
       free( tblk ); 
       free( tardim ); 
    } else {
       for(j=0;j<ndims;j++)
          if(pedims[j]<0) pedims[j] = 1;
    }

}